

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O2

void Commands::Inventory(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *arguments,Character *from)

{
  World *pWVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Character *this;
  mapped_type *this_00;
  string *this_01;
  PacketBuilder *this_02;
  _List_node_base *p_Var5;
  allocator<char> local_121;
  string local_120;
  PacketBuilder reply;
  string local_d0;
  string name;
  string local_90;
  string local_70;
  string local_50;
  
  pWVar1 = from->world;
  std::__cxx11::string::string
            ((string *)&local_50,
             (string *)
             (arguments->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start);
  this = World::GetCharacter(pWVar1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (this == (Character *)0x0) {
    pWVar1 = from->world;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&reply,"character_not_found",(allocator<char> *)&name);
    I18N::Format<>(&local_70,&pWVar1->i18n,(string *)&reply);
    (*(from->super_Command_Source)._vptr_Command_Source[5])(from,&local_70);
    this_01 = &local_70;
LAB_0011ff86:
    std::__cxx11::string::~string((string *)this_01);
    this_02 = &reply;
    goto LAB_001202b2;
  }
  uVar2 = (**(this->super_Command_Source)._vptr_Command_Source)(this);
  pWVar1 = from->world;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&reply,"cmdprotect",(allocator<char> *)&name);
  this_00 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar1->admin_config,(key_type *)&reply);
  iVar3 = util::variant::GetInt(this_00);
  if ((int)(uVar2 & 0xff) < iVar3) {
    std::__cxx11::string::~string((string *)&reply);
  }
  else {
    iVar3 = (**(this->super_Command_Source)._vptr_Command_Source)(this);
    iVar4 = (**(from->super_Command_Source)._vptr_Command_Source)(from);
    std::__cxx11::string::~string((string *)&reply);
    if ((byte)iVar4 < (byte)iVar3) {
      pWVar1 = from->world;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&reply,"command_access_denied",(allocator<char> *)&name);
      I18N::Format<>(&local_90,&pWVar1->i18n,(string *)&reply);
      (*(from->super_Command_Source)._vptr_Command_Source[5])(from,&local_90);
      this_01 = &local_90;
      goto LAB_0011ff86;
    }
  }
  (*(this->super_Command_Source)._vptr_Command_Source[2])(&reply,this);
  util::ucfirst(&name,(string *)&reply);
  std::__cxx11::string::~string((string *)&reply);
  PacketBuilder::PacketBuilder
            (&reply,PACKET_ADMININTERACT,PACKET_LIST,
             (this->bank).super__List_base<Character_Item,_std::allocator<Character_Item>_>._M_impl.
             _M_node._M_size * 7 +
             (this->inventory).super__List_base<Character_Item,_std::allocator<Character_Item>_>.
             _M_impl._M_node._M_size * 6 + name._M_string_length + 0x20);
  switch(this->admin) {
  case ADMIN_GUIDE:
    pWVar1 = from->world;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"light_guide_title",&local_121);
    I18N::Format<std::__cxx11::string&>(&local_120,&pWVar1->i18n,&local_d0,&name);
    PacketBuilder::AddString(&reply,&local_120);
    break;
  case ADMIN_GUARDIAN:
    pWVar1 = from->world;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"guardian_title",&local_121);
    I18N::Format<std::__cxx11::string&>(&local_120,&pWVar1->i18n,&local_d0,&name);
    PacketBuilder::AddString(&reply,&local_120);
    break;
  case ADMIN_GM:
    pWVar1 = from->world;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"game_master_title",&local_121);
    I18N::Format<std::__cxx11::string&>(&local_120,&pWVar1->i18n,&local_d0,&name);
    PacketBuilder::AddString(&reply,&local_120);
    break;
  case ADMIN_HGM:
    pWVar1 = from->world;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"high_game_master_title",&local_121);
    I18N::Format<std::__cxx11::string&>(&local_120,&pWVar1->i18n,&local_d0,&name);
    PacketBuilder::AddString(&reply,&local_120);
    break;
  default:
    PacketBuilder::AddString(&reply,&name);
    goto LAB_00120165;
  }
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_d0);
LAB_00120165:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120," ",(allocator<char> *)&local_d0);
  PacketBuilder::AddString(&reply,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  Character::PaddedGuildTag_abi_cxx11_(&local_d0,this);
  util::trim(&local_120,&local_d0);
  PacketBuilder::AddBreakString(&reply,&local_120,0xff);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_d0);
  iVar3 = Character::Usage(this);
  PacketBuilder::AddInt(&reply,iVar3);
  PacketBuilder::AddByte(&reply,0xff);
  PacketBuilder::AddInt(&reply,this->goldbank);
  PacketBuilder::AddByte(&reply,0xff);
  p_Var5 = (_List_node_base *)&this->inventory;
  while (p_Var5 = (((_List_base<Character_Item,_std::allocator<Character_Item>_> *)&p_Var5->_M_next)
                  ->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var5 != (_List_node_base *)&this->inventory) {
    iVar3 = *(int *)((long)&p_Var5[1]._M_next + 4);
    PacketBuilder::AddShort(&reply,(int)*(short *)&p_Var5[1]._M_next);
    PacketBuilder::AddInt(&reply,iVar3);
  }
  PacketBuilder::AddByte(&reply,0xff);
  p_Var5 = (_List_node_base *)&this->bank;
  while (p_Var5 = (((_List_base<Character_Item,_std::allocator<Character_Item>_> *)&p_Var5->_M_next)
                  ->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var5 != (_List_node_base *)&this->bank) {
    iVar3 = *(int *)((long)&p_Var5[1]._M_next + 4);
    PacketBuilder::AddShort(&reply,(int)*(short *)&p_Var5[1]._M_next);
    PacketBuilder::AddThree(&reply,iVar3);
  }
  Character::Send(from,&reply);
  PacketBuilder::~PacketBuilder(&reply);
  this_02 = (PacketBuilder *)&name;
LAB_001202b2:
  std::__cxx11::string::~string((string *)this_02);
  return;
}

Assistant:

void Inventory(const std::vector<std::string>& arguments, Character* from)
{
	Character *victim = from->world->GetCharacter(arguments[0]);

	if (!victim)
	{
		from->ServerMsg(from->world->i18n.Format("character_not_found"));
	}
	else
	{
		if (victim->SourceAccess() < int(from->world->admin_config["cmdprotect"])
		 || victim->SourceAccess() <= from->SourceAccess())
		{
			std::string name = util::ucfirst(victim->SourceName());

			PacketBuilder reply(PACKET_ADMININTERACT, PACKET_LIST, 32 + name.length() + victim->inventory.size() * 6 + victim->bank.size() * 7);

			switch (victim->admin)
			{
				case ADMIN_HGM:      reply.AddString(from->world->i18n.Format("high_game_master_title", name)); break;
				case ADMIN_GM:       reply.AddString(from->world->i18n.Format("game_master_title", name)); break;
				case ADMIN_GUARDIAN: reply.AddString(from->world->i18n.Format("guardian_title", name)); break;
				case ADMIN_GUIDE:    reply.AddString(from->world->i18n.Format("light_guide_title", name)); break;
				default:             reply.AddString(name); break;
			}

			reply.AddString(" ");
			reply.AddBreakString(util::trim(victim->PaddedGuildTag()));
			reply.AddInt(victim->Usage());
			reply.AddByte(255);
			reply.AddInt(victim->goldbank);
			reply.AddByte(255);

			UTIL_FOREACH(victim->inventory, item)
			{
				reply.AddShort(item.id);
				reply.AddInt(item.amount);
			}
			reply.AddByte(255);

			UTIL_FOREACH(victim->bank, item)
			{
				reply.AddShort(item.id);
				reply.AddThree(item.amount);
			}

			from->Send(reply);
		}
		else
		{
			from->ServerMsg(from->world->i18n.Format("command_access_denied"));
		}
	}
}